

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataQueryPdu.cpp
# Opt level: O3

bool __thiscall DIS::DataQueryPdu::operator==(DataQueryPdu *this,DataQueryPdu *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  undefined4 unaff_EBP;
  undefined4 uVar7;
  pointer pFVar8;
  pointer pVVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  
  bVar5 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  uVar1 = this->_requestID;
  uVar3 = this->_timeInterval;
  uVar2 = rhs->_requestID;
  uVar4 = rhs->_timeInterval;
  auVar12._4_4_ = -(uint)(uVar2 == uVar1);
  auVar12._0_4_ = -(uint)(uVar2 == uVar1);
  auVar12._8_4_ = -(uint)(uVar4 == uVar3);
  auVar12._12_4_ = -(uint)(uVar4 == uVar3);
  uVar7 = movmskpd(unaff_EBP,auVar12);
  bVar5 = (bool)((byte)uVar7 >> 1 & bVar5 & (byte)uVar7);
  pFVar8 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar8) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      bVar6 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar8->_vptr_FixedDatum + lVar11),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatums).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar11));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar10 = uVar10 + 1;
      pFVar8 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x10;
    } while (uVar10 < (ulong)((long)(this->_fixedDatums).
                                    super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar8 >> 4))
    ;
  }
  pVVar9 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatums).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar9) {
    lVar11 = 0;
    uVar10 = 0;
    do {
      bVar6 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar9->_vptr_VariableDatum + lVar11),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatums).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar11));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar10 = uVar10 + 1;
      pVVar9 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x30;
    } while (uVar10 < (ulong)(((long)(this->_variableDatums).
                                     super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 4)
                             * -0x5555555555555555));
  }
  return bVar5;
}

Assistant:

bool DataQueryPdu::operator ==(const DataQueryPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_timeInterval == rhs._timeInterval) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }